

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O0

pair<int,_int> __thiscall
NoMeEdgeCalculator::mixedReadDetermination
          (NoMeEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  pair<int,_int> pVar5;
  AlignmentRecord *in_RDX;
  AlignmentRecord *in_RSI;
  int *in_stack_ffffffffffffff28;
  pair<int,_int> local_8;
  
  bVar2 = AlignmentRecord::isSingleEnd(in_RSI);
  if (bVar2) {
    uVar3 = AlignmentRecord::getStart1(in_RSI);
    uVar4 = AlignmentRecord::getEnd1(in_RDX);
    if (uVar4 < uVar3) {
      uVar3 = AlignmentRecord::getEnd1(in_RSI);
      uVar4 = AlignmentRecord::getStart2(in_RDX);
      if (uVar3 < uVar4) {
        pVar5 = std::make_pair<int,int>(in_stack_ffffffffffffff28,(int *)0x268b20);
        return pVar5;
      }
    }
    uVar3 = AlignmentRecord::getEnd1(in_RSI);
    uVar4 = AlignmentRecord::getStart1(in_RDX);
    if (uVar3 < uVar4) {
      local_8 = std::make_pair<int,int>(in_stack_ffffffffffffff28,(int *)0x268b80);
    }
    else {
      uVar3 = AlignmentRecord::getStart1(in_RSI);
      uVar4 = AlignmentRecord::getEnd2(in_RDX);
      if (uVar3 <= uVar4) {
        uVar3 = AlignmentRecord::getStart1(in_RSI);
        uVar4 = AlignmentRecord::getEnd1(in_RDX);
        if (uVar3 < uVar4) {
          uVar3 = AlignmentRecord::getEnd1(in_RSI);
          uVar4 = AlignmentRecord::getStart2(in_RDX);
          if (uVar3 < uVar4) {
            pVar5 = std::make_pair<int,int>(in_stack_ffffffffffffff28,(int *)0x268c68);
            return pVar5;
          }
        }
        uVar3 = AlignmentRecord::getStart1(in_RSI);
        uVar4 = AlignmentRecord::getEnd1(in_RDX);
        if (uVar4 < uVar3) {
          uVar3 = AlignmentRecord::getEnd1(in_RSI);
          uVar4 = AlignmentRecord::getStart2(in_RDX);
          if (uVar4 < uVar3) {
            pVar5 = std::make_pair<int,int>(in_stack_ffffffffffffff28,(int *)0x268cf0);
            return pVar5;
          }
        }
        uVar3 = AlignmentRecord::getStart1(in_RSI);
        uVar4 = AlignmentRecord::getEnd1(in_RDX);
        if (uVar3 < uVar4) {
          uVar3 = AlignmentRecord::getEnd1(in_RSI);
          uVar4 = AlignmentRecord::getStart2(in_RDX);
          if (uVar4 < uVar3) {
            pVar5 = std::make_pair<int,int>(in_stack_ffffffffffffff28,(int *)0x268d78);
            return pVar5;
          }
        }
        goto LAB_00269059;
      }
      local_8 = std::make_pair<int,int>(in_stack_ffffffffffffff28,(int *)0x268be0);
    }
  }
  else {
    bVar2 = AlignmentRecord::isPairedEnd(in_RSI);
    if (!bVar2) {
LAB_00269059:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    uVar3 = AlignmentRecord::getStart1(in_RDX);
    uVar4 = AlignmentRecord::getEnd1(in_RSI);
    if (uVar4 < uVar3) {
      uVar3 = AlignmentRecord::getEnd1(in_RDX);
      uVar4 = AlignmentRecord::getStart2(in_RSI);
      if (uVar3 < uVar4) {
        pVar5 = std::make_pair<int,int>(in_stack_ffffffffffffff28,(int *)0x268e25);
        return pVar5;
      }
    }
    uVar3 = AlignmentRecord::getStart1(in_RDX);
    uVar4 = AlignmentRecord::getEnd2(in_RSI);
    if (uVar4 < uVar3) {
      local_8 = std::make_pair<int,int>(in_stack_ffffffffffffff28,(int *)0x268e79);
    }
    else {
      uVar3 = AlignmentRecord::getEnd1(in_RDX);
      uVar4 = AlignmentRecord::getStart1(in_RSI);
      if (uVar4 <= uVar3) {
        uVar3 = AlignmentRecord::getStart1(in_RDX);
        uVar4 = AlignmentRecord::getEnd1(in_RSI);
        if (uVar3 < uVar4) {
          uVar3 = AlignmentRecord::getEnd1(in_RDX);
          uVar4 = AlignmentRecord::getStart2(in_RSI);
          if (uVar3 < uVar4) {
            pVar5 = std::make_pair<int,int>(in_stack_ffffffffffffff28,(int *)0x268f49);
            return pVar5;
          }
        }
        uVar3 = AlignmentRecord::getStart1(in_RDX);
        uVar4 = AlignmentRecord::getEnd1(in_RSI);
        if (uVar4 < uVar3) {
          uVar3 = AlignmentRecord::getEnd1(in_RDX);
          uVar4 = AlignmentRecord::getStart2(in_RSI);
          if (uVar4 < uVar3) {
            pVar5 = std::make_pair<int,int>(in_stack_ffffffffffffff28,(int *)0x268fc5);
            return pVar5;
          }
        }
        uVar3 = AlignmentRecord::getStart1(in_RDX);
        uVar4 = AlignmentRecord::getEnd2(in_RSI);
        if (uVar3 < uVar4) {
          uVar3 = AlignmentRecord::getEnd1(in_RDX);
          uVar4 = AlignmentRecord::getStart2(in_RSI);
          if (uVar4 < uVar3) {
            pVar5 = std::make_pair<int,int>(in_stack_ffffffffffffff28,(int *)0x269041);
            return pVar5;
          }
        }
        goto LAB_00269059;
      }
      local_8 = std::make_pair<int,int>(in_stack_ffffffffffffff28,(int *)0x268ecd);
    }
  }
  return local_8;
}

Assistant:

std::pair<int , int> NoMeEdgeCalculator::mixedReadDetermination(const AlignmentRecord & ap1, const AlignmentRecord & ap2) const{

    //ap1 is always the read on top in the figures
    if(ap1.isSingleEnd()){
        if((ap1.getStart1()>ap2.getEnd1())&&(ap1.getEnd1()<ap2.getStart2())){
            //             ------
            //   ---------          ----------
            return std::make_pair(0, 0);
        }else if(ap1.getEnd1()<ap2.getStart1()){
            //  ------
            //              ---------       ----------
            return std::make_pair(0, 0);
        }else if(ap1.getStart1()>ap2.getEnd2()){
            //                              ------
            //  ---------       ----------
            return std::make_pair(0, 0);
        }else if((ap1.getStart1()<ap2.getEnd1())&&(ap1.getEnd1()<ap2.getStart2())){
            //   ----------
            //  --------       -----------
            return std::make_pair(1, 1);
        }else if((ap1.getStart1()>ap2.getEnd1())&&(ap1.getEnd1()>ap2.getStart2())){
            //               ------------
            //   -------        ------------
            return std::make_pair(1, 2);
        }else if((ap1.getStart1()<ap2.getEnd1())&&(ap1.getEnd1()>ap2.getStart2())){
            //       --------------
            //   ---------    ----------
            return std::make_pair(1, 3);
        }

    }else if(ap1.isPairedEnd()){
        if((ap2.getStart1()>ap1.getEnd1())&&(ap2.getEnd1()<ap1.getStart2())){
            //  ----------             ------------
            //             ---------
            return std::make_pair(0, 0);
        }else if(ap2.getStart1()>ap1.getEnd2()){
            //  ----------      ------------
            //                                   ---------
            return std::make_pair(0, 0);
        }else if(ap2.getEnd1()<ap1.getStart1()){
            //                     ----------      ------------
            //    ---------
            return std::make_pair(0, 0);
        }else if((ap2.getStart1()<ap1.getEnd1())&&(ap2.getEnd1()<ap1.getStart2())){
            //   ----------    -------------
            //  --------
            return std::make_pair(1, 1);
        }else if((ap2.getStart1()>ap1.getEnd1())&&(ap2.getEnd1()>ap1.getStart2())){
            // ------------       ------------
            //                  ------------
            return std::make_pair(2, 1);
        }else if((ap2.getStart1()<ap1.getEnd2())&&(ap2.getEnd1()>ap1.getStart2())){
            //  ----------      ------------
            //      -------------------
            return std::make_pair(1, 4);
        }
    }

}